

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O3

IntrinsicResult MiniScript::intrinsic_sum(Context *context,IntrinsicResult partialResult)

{
  ValueType VVar1;
  RefCountedStorage *pRVar2;
  bool bVar3;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar4;
  long *plVar5;
  undefined4 *puVar6;
  HashMapEntry<MiniScript::Value,_MiniScript::Value> *pHVar7;
  ulong uVar8;
  long lVar9;
  _func_int **pp_Var10;
  anon_union_8_3_2f476f46_for_data aVar11;
  int i;
  int iVar12;
  ulong uVar13;
  double dVar14;
  RefCountedStorage *pRVar15;
  Value val;
  ValueDict map;
  double local_80;
  undefined1 local_78 [16];
  long *local_68;
  char local_60;
  Value local_58;
  ValueDict local_48;
  
  local_60 = '\0';
  plVar5 = (long *)operator_new(0x30);
  plVar5[1] = 1;
  *plVar5 = (long)&PTR__StringStorage_001bf0d8;
  plVar5[3] = 5;
  plVar5[4] = -1;
  puVar6 = (undefined4 *)operator_new__(5);
  plVar5[2] = (long)puVar6;
  *(undefined1 *)(puVar6 + 1) = 0;
  *puVar6 = 0x666c6573;
  local_68 = plVar5;
  Context::GetVar((Context *)local_78,(String *)partialResult.rs,(LocalOnlyMode)&local_68);
  if ((local_68 != (long *)0x0) && (local_60 == '\0')) {
    plVar5 = local_68 + 1;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (**(code **)(*local_68 + 8))();
    }
    local_68 = (long *)0x0;
  }
  aVar11 = (anon_union_8_3_2f476f46_for_data)local_78._8_8_;
  if (local_78[0] == Map) {
    Value::GetDict(&local_48,(Value *)local_78);
    pDVar4 = local_48.ds;
    if (local_48.ds == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      local_80 = 0.0;
      goto LAB_001516e2;
    }
    uVar13 = 0;
    do {
      pHVar7 = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)
               (&((RefCountedStorage *)((long)local_48.ds + 0x10))->refCount)[uVar13];
      if (pHVar7 != (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) {
        local_80 = 0.0;
        goto LAB_00151606;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0xfb);
    local_80 = 0.0;
    goto LAB_001516c4;
  }
  local_80 = 0.0;
  if ((local_78[0] != List) ||
     ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_78._8_8_ ==
      (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) goto LAB_001516e2;
  *(long *)(local_78._8_8_ + 8) = *(long *)(local_78._8_8_ + 8) + 1;
  pp_Var10 = ((RefCountedStorage *)(local_78._8_8_ + 0x20))->_vptr_RefCountedStorage;
  if ((long)pp_Var10 < 1) {
    local_80 = 0.0;
  }
  else {
    lVar9 = (long)pp_Var10 << 4;
    local_80 = 0.0;
    do {
      lVar9 = lVar9 + -0x10;
      if ((long)aVar11.ref[2]._vptr_RefCountedStorage < (long)pp_Var10) {
        _Error("invalid index in SimpleVector::operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
               ,0xc1);
        pHVar7 = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)aVar11.ref[1].refCount;
      }
      else {
        pHVar7 = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)
                 ((long)aVar11.ref[1].refCount + lVar9);
      }
      if (*(char *)&pHVar7->next == '\x01') {
        dVar14 = *(double *)&pHVar7->key;
      }
      else {
        dVar14 = 0.0;
      }
      local_80 = local_80 + dVar14;
      bVar3 = (_func_int **)0x1 < pp_Var10;
      pp_Var10 = (_func_int **)((long)pp_Var10 - 1);
    } while (bVar3);
  }
  goto LAB_001516d3;
LAB_00151606:
  do {
    VVar1 = (pHVar7->value).type;
    pRVar2 = (pHVar7->value).data.ref;
    if (pRVar2 == (RefCountedStorage *)0x0 || VVar1 < String) {
      pRVar15 = pRVar2;
      if (VVar1 != Number) {
        pRVar15 = (RefCountedStorage *)0x0;
      }
      local_80 = local_80 + (double)pRVar15;
      if (pRVar2 != (RefCountedStorage *)0x0 && Temp < VVar1) goto LAB_00151667;
    }
    else {
      pRVar2->refCount = pRVar2->refCount + 1;
      local_80 = local_80 + 0.0;
LAB_00151667:
      plVar5 = &pRVar2->refCount;
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*pRVar2->_vptr_RefCountedStorage[1])();
      }
    }
    pHVar7 = pHVar7->next;
  } while (pHVar7 != (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0);
  iVar12 = (int)uVar13;
  uVar8 = 0xfa;
  if (0xfa < iVar12) {
    uVar8 = uVar13 & 0xffffffff;
  }
  if (iVar12 < 0xfa) {
    uVar13 = (ulong)iVar12;
    while( true ) {
      pHVar7 = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)
               (&((RefCountedStorage *)((long)pDVar4 + 0x20))->_vptr_RefCountedStorage)[uVar13];
      uVar13 = uVar13 + 1;
      if (pHVar7 != (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) break;
      if (uVar8 == uVar13) goto LAB_001516ae;
    }
    goto LAB_00151606;
  }
LAB_001516ae:
  local_48._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001bf240;
  if (local_48.ds == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)
  goto LAB_001516e2;
LAB_001516c4:
  local_48._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001bf240;
  aVar11 = (anon_union_8_3_2f476f46_for_data)local_48.ds;
  if (local_48.isTemp != false) goto LAB_001516e2;
LAB_001516d3:
  plVar5 = &(aVar11.ref)->refCount;
  *plVar5 = *plVar5 + -1;
  if (*plVar5 == 0) {
    (*((RefCountedStorage *)&(aVar11.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage[1])
              (aVar11.number);
  }
LAB_001516e2:
  local_58.type = Number;
  local_58.noInvoke = false;
  local_58.localOnly = Off;
  local_58.data.number = local_80;
  (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
  IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                   &local_58);
  *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
  if ((Temp < local_58.type) && (local_58.data.ref != (RefCountedStorage *)0x0)) {
    plVar5 = &(local_58.data.ref)->refCount;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*(local_58.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_58.data.number = 0.0;
  }
  if ((Temp < local_78[0]) &&
     ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_78._8_8_ !=
      (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
    plVar5 = (long *)(local_78._8_8_ + 8);
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*((RefCountedStorage *)local_78._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_sum(Context *context, IntrinsicResult partialResult) {
		Value val = context->GetVar("self");
		double sum = 0;
		if (val.type == ValueType::List) {
			ValueList list = val.GetList();
			for (long i=list.Count()-1; i>=0; i--) {
				sum += list[i].DoubleValue();
			}
		} else if (val.type == ValueType::Map) {
			ValueDict map = val.GetDict();
			for (ValueDictIterator kv = map.GetIterator(); !kv.Done(); kv.Next()) {
				sum += kv.Value().DoubleValue();
			}
		}
		return IntrinsicResult(sum);
	}